

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_printf(bcf_hdr_t *hdr,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_4c;
  char *pcStack_48;
  int ret;
  char *line;
  undefined4 local_38;
  int n;
  va_list ap;
  char *fmt_local;
  bcf_hdr_t *hdr_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  n = 0x30;
  local_38 = 0x10;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  ap[0]._0_8_ = &stack0x00000008;
  ap[0].overflow_arg_area = local_108;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&local_38);
  line._4_4_ = iVar1 + 2;
  pcStack_48 = (char *)malloc((long)line._4_4_);
  n = 0x30;
  local_38 = 0x10;
  ap[0]._0_8_ = &stack0x00000008;
  ap[0].overflow_arg_area = local_108;
  vsnprintf(pcStack_48,(long)line._4_4_,fmt,&local_38);
  local_4c = bcf_hdr_append(hdr,pcStack_48);
  free(pcStack_48);
  return local_4c;
}

Assistant:

int bcf_hdr_printf(bcf_hdr_t *hdr, const char *fmt, ...)
{
    va_list ap;
    va_start(ap, fmt);
    int n = vsnprintf(NULL, 0, fmt, ap) + 2;
    va_end(ap);

    char *line = (char*)malloc(n);
    va_start(ap, fmt);
    vsnprintf(line, n, fmt, ap);
    va_end(ap);

    int ret = bcf_hdr_append(hdr, line);

    free(line);
    return ret;
}